

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDepends
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,cmNinjaDeps *outputs,
          cmNinjaTargetDepends depends)

{
  pointer pcVar1;
  long lVar2;
  pointer pbVar3;
  TargetType TVar4;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar5;
  cmLocalGenerator *this_00;
  string *psVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  TargetDependSet *pTVar9;
  _Rb_tree_node_base *p_Var10;
  ulong uVar11;
  pointer pbVar12;
  _Rb_tree_header *p_Var13;
  string d;
  undefined1 local_78 [32];
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_58 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)outputs;
  TVar4 = cmGeneratorTarget::GetType(target);
  if (TVar4 == GLOBAL_TARGET) {
    psVar5 = cmGeneratorTarget::GetUtilities_abi_cxx11_(target);
    p_Var8 = (psVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var13 = &(psVar5->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var8 != p_Var13) {
      do {
        this_00 = cmGeneratorTarget::GetLocalGenerator(target);
        psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this_00);
        local_50[0] = local_40;
        pcVar1 = (psVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + psVar6->_M_string_length);
        std::__cxx11::string::append((char *)local_50);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_50,*(ulong *)(p_Var8 + 1));
        pbVar12 = (pointer)(plVar7 + 2);
        if ((pointer)*plVar7 == pbVar12) {
          local_78._16_8_ = (pbVar12->_M_dataplus)._M_p;
          local_78._24_8_ = plVar7[3];
          local_78._0_8_ = (pointer)(local_78 + 0x10);
        }
        else {
          local_78._16_8_ = (pbVar12->_M_dataplus)._M_p;
          local_78._0_8_ = (pointer)*plVar7;
        }
        local_78._8_8_ = plVar7[1];
        *plVar7 = (long)pbVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        psVar6 = ConvertToNinjaPath(this,(string *)local_78);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_58,psVar6);
        if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
          operator_delete((void *)local_78._0_8_,(ulong)(local_78._16_8_ + 1));
        }
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      } while ((_Rb_tree_header *)p_Var8 != p_Var13);
    }
  }
  else {
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = (pointer)0x0;
    local_78._16_8_ = (pointer)0x0;
    pTVar9 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
    p_Var10 = (pTVar9->
              super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)
              ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pbVar12 = (pointer)local_78._0_8_;
    pbVar3 = (pointer)local_78._8_8_;
    while (local_78._0_8_ = pbVar12, local_78._8_8_ = pbVar3,
          (_Rb_tree_header *)p_Var10 !=
          &(pTVar9->
           super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>).
           _M_t._M_impl.super__Rb_tree_header) {
      TVar4 = cmGeneratorTarget::GetType(*(cmGeneratorTarget **)(p_Var10 + 1));
      if (TVar4 != INTERFACE_LIBRARY) {
        AppendTargetOutputs(this,*(cmGeneratorTarget **)(p_Var10 + 1),(cmNinjaDeps *)local_78,
                            depends);
      }
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
      pbVar12 = (pointer)local_78._0_8_;
      pbVar3 = (pointer)local_78._8_8_;
    }
    if (pbVar12 != pbVar3) {
      uVar11 = (long)pbVar3 - (long)pbVar12 >> 5;
      lVar2 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar12,pbVar3,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pbVar12,pbVar3);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (local_58,*(undefined8 *)(local_58 + 8),local_78._0_8_,local_78._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDepends(
  cmGeneratorTarget const* target, cmNinjaDeps& outputs,
  cmNinjaTargetDepends depends)
{
  if (target->GetType() == cmStateEnums::GLOBAL_TARGET) {
    // These depend only on other CMake-provided targets, e.g. "all".
    std::set<BT<std::string>> const& utils = target->GetUtilities();
    for (BT<std::string> const& util : utils) {
      std::string d =
        target->GetLocalGenerator()->GetCurrentBinaryDirectory() + "/" +
        util.Value;
      outputs.push_back(this->ConvertToNinjaPath(d));
    }
  } else {
    cmNinjaDeps outs;
    cmTargetDependSet const& targetDeps = this->GetTargetDirectDepends(target);
    for (cmTargetDepend const& targetDep : targetDeps) {
      if (targetDep->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        continue;
      }
      this->AppendTargetOutputs(targetDep, outs, depends);
    }
    std::sort(outs.begin(), outs.end());
    outputs.insert(outputs.end(), outs.begin(), outs.end());
  }
}